

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tunnel_connector.cpp
# Opt level: O3

shared_ptr<bidfx_public_api::tools::Client> __thiscall
bidfx_public_api::tools::TunnelConnector::Connect(TunnelConnector *this,milliseconds read_timeout)

{
  logger *this_00;
  char cVar1;
  undefined4 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  OpenSSLClient *client;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<bidfx_public_api::tools::Client> sVar5;
  undefined1 local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  OpenSSLClient *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  int local_34;
  milliseconds read_timeout_local;
  
  cVar1 = (**(code **)(**(long **)read_timeout.__r + 0x40))();
  this_00 = Log;
  if (cVar1 == '\0') {
    (**(code **)**(undefined8 **)read_timeout.__r)(&local_68);
    uVar2 = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    local_48 = (OpenSSLClient *)CONCAT44(local_48._4_4_,uVar2);
    spdlog::logger::log<std::__cxx11::string,int>
              (this_00,(source_loc)ZEXT816(0x1c3d25),info,"Connecting to {}:{}",&local_68,
               (int *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    (**(code **)**(undefined8 **)read_timeout.__r)(&local_68);
    local_34 = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    local_48 = (OpenSSLClient *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bidfx_public_api::tools::DirectClient,std::allocator<bidfx_public_api::tools::DirectClient>,std::__cxx11::string,int>
              (&_Stack_40,(DirectClient **)&local_48,
               (allocator<bidfx_public_api::tools::DirectClient> *)&local_69,&local_68,&local_34);
    _Var4._M_pi = _Stack_40._M_pi;
    client = local_48;
    local_48 = (OpenSSLClient *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    (*(client->super_Client)._vptr_Client[2])(client);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    (**(code **)**(undefined8 **)read_timeout.__r)(&local_68);
    local_34 = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    spdlog::logger::log<std::__cxx11::string,int,long>
              (this_00,(source_loc)ZEXT816(0x1c3d25),info,
               "Connecting using SSL to {}:{} with read timeout {}ms",&local_68,&local_34,
               (long *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    (**(code **)**(undefined8 **)read_timeout.__r)(&local_68);
    local_34 = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    local_48 = (OpenSSLClient *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bidfx_public_api::tools::OpenSSLClient,std::allocator<bidfx_public_api::tools::OpenSSLClient>,std::__cxx11::string,int,std::chrono::duration<long,std::ratio<1l,1000l>>&>
              (&_Stack_40,&local_48,(allocator<bidfx_public_api::tools::OpenSSLClient> *)&local_69,
               &local_68,&local_34,&read_timeout_local);
    _Var4._M_pi = _Stack_40._M_pi;
    client = local_48;
    local_48 = (OpenSSLClient *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    (*(client->super_Client)._vptr_Client[2])(client);
    TunnelThroughToServer((TunnelConnector *)read_timeout.__r,&client->super_Client);
    _Var3._M_pi = extraout_RDX;
  }
  this->user_info_ = (UserInfo *)client;
  (this->service_)._M_dataplus._M_p = (pointer)_Var4._M_pi;
  sVar5.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<bidfx_public_api::tools::Client>)
         sVar5.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Client> TunnelConnector::Connect(std::chrono::milliseconds read_timeout)
{
    try
    {
        std::shared_ptr<Client> client = nullptr;

        if (user_info_.IsTunnelRequired())
        {
            Log->info("Connecting using SSL to {}:{} with read timeout {}ms", user_info_.GetHost(), user_info_.GetPort(), read_timeout.count());
            client = std::make_shared<OpenSSLClient>(user_info_.GetHost(), user_info_.GetPort(), read_timeout);
            client->Start();
            TunnelThroughToServer(*client);
        }
        else
        {
            Log->info("Connecting to {}:{}", user_info_.GetHost(), user_info_.GetPort());
            client = std::make_shared<DirectClient>(user_info_.GetHost(), user_info_.GetPort());
            client->Start();
        }

        return std::move(client);
    }
    catch (std::ios_base::failure &e)
    {
        Log->warn("exception during handshake: {}", e.what());
        throw std::ios_base::failure(e);
    }
}